

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_add(REF_NODE ref_node,REF_GLOB global,REF_INT *node)

{
  REF_GLOB *pRVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  ulong uVar6;
  REF_INT *pRVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  
  if (global < 0) {
    pcVar10 = "invalid global node";
    uVar2 = 3;
    uVar5 = 0x150;
    uVar8 = 3;
  }
  else {
    uVar2 = ref_node_local(ref_node,global,node);
    if (uVar2 == 0) {
      return 0;
    }
    if (uVar2 == 5) {
      uVar2 = ref_node_add_core(ref_node,global,node);
      if (uVar2 == 0) {
        iVar3 = ref_node->n;
        if (1 < iVar3) {
          uVar8 = (ulong)(iVar3 - 1);
          do {
            uVar2 = (int)uVar8 - 1;
            if (ref_node->sorted_global[uVar2] < global) goto LAB_00164d97;
            uVar8 = (ulong)uVar2;
          } while (0 < (int)uVar2);
        }
        uVar8 = 0;
LAB_00164d97:
        uVar2 = iVar3 - 1;
        iVar4 = (int)uVar8;
        if (iVar4 < (int)uVar2) {
          pRVar1 = ref_node->sorted_global;
          uVar6 = (ulong)uVar2;
          uVar11 = uVar6;
          iVar9 = iVar3;
          do {
            pRVar1[uVar11] = pRVar1[(long)iVar9 + -2];
            uVar11 = uVar11 - 1;
            iVar9 = iVar9 + -1;
          } while ((long)uVar8 < (long)uVar11);
          if (iVar4 < (int)uVar2) {
            pRVar7 = ref_node->sorted_local;
            do {
              pRVar7[uVar6] = pRVar7[(long)iVar3 + -2];
              uVar6 = uVar6 - 1;
              iVar3 = iVar3 + -1;
            } while ((long)iVar4 < (long)uVar6);
            goto LAB_00164de9;
          }
        }
        pRVar7 = ref_node->sorted_local;
LAB_00164de9:
        ref_node->sorted_global[uVar8] = global;
        pRVar7[uVar8] = *node;
        return 0;
      }
      pcVar10 = "core";
      uVar5 = 0x156;
    }
    else {
      pcVar10 = "ref_node_local unexpected status";
      uVar5 = 0x154;
    }
    uVar8 = (ulong)uVar2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
         "ref_node_add",uVar8,pcVar10);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_node_add(REF_NODE ref_node, REF_GLOB global,
                                REF_INT *node) {
  REF_INT location, insert_point;
  REF_STATUS status;

  if (global < 0) RSS(REF_INVALID, "invalid global node");

  status = ref_node_local(ref_node, global, node);
  if (REF_SUCCESS == status) return REF_SUCCESS;
  RXS(status, REF_NOT_FOUND, "ref_node_local unexpected status");

  RSS(ref_node_add_core(ref_node, global, node), "core");

  /* general case of non-ascending global node, requires:
     search and shift (but looks to see if bigger than last early) */
  insert_point = 0;
  for (location = ref_node_n(ref_node) - 2; location >= 0; location--) {
    if (ref_node->sorted_global[location] < global) {
      insert_point = location + 1;
      break;
    }
  }

  /* shift down to clear insert_point */
  for (location = ref_node_n(ref_node) - 1; location > insert_point; location--)
    ref_node->sorted_global[location] = ref_node->sorted_global[location - 1];
  for (location = ref_node_n(ref_node) - 1; location > insert_point; location--)
    ref_node->sorted_local[location] = ref_node->sorted_local[location - 1];

  /* insert in empty location */
  ref_node->sorted_global[insert_point] = global;
  ref_node->sorted_local[insert_point] = *node;

  return REF_SUCCESS;
}